

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

var cs_impl::hash_set_cs_ext::subtract(hash_set *lhs,hash_set *rhs)

{
  bool bVar1;
  anon_union_8_1_a8a14541_for_iterator_1 this;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_RDI;
  const_iterator cVar2;
  iterator iVar3;
  any *unaff_retaddr;
  value_type *it;
  const_iterator __end2;
  const_iterator __begin2;
  hash_set *__range2;
  hash_set *s;
  var *ret;
  const_iterator *in_stack_ffffffffffffff48;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_ffffffffffffff50;
  undefined8 local_a0;
  flat_hash_set<cs_impl::any,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *in_stack_ffffffffffffff68;
  key_arg<cs_impl::any> *key;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
  *this_00;
  
  this_00 = in_RDI;
  any::
  make<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>,phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>const&>
            (in_stack_ffffffffffffff68);
  any::
  val<phmap::flat_hash_set<cs_impl::any,phmap::Hash<cs_impl::any>,phmap::EqualTo<cs_impl::any>,std::allocator<cs_impl::any>>>
            (unaff_retaddr);
  cVar2 = phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ::begin(in_stack_ffffffffffffff50);
  this = cVar2.inner_.field_1;
  iVar3 = (iterator)
          phmap::priv::
          raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          ::end(in_stack_ffffffffffffff50);
  while( true ) {
    local_a0 = iVar3.field_1;
    key = (key_arg<cs_impl::any> *)iVar3.ctrl_;
    bVar1 = phmap::priv::operator!=
                      ((const_iterator *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    in_stack_ffffffffffffff50 =
         (raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
          *)phmap::priv::
            raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
            ::const_iterator::operator*((const_iterator *)0x23186c);
    in_stack_ffffffffffffff48 =
         (const_iterator *)
         phmap::priv::
         raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
         ::count<cs_impl::any>
                   ((raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
                     *)this.slot_,key);
    if (in_stack_ffffffffffffff48 != (const_iterator *)0x0) {
      phmap::priv::
      raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
      ::erase<cs_impl::any>(this_00,(key_arg<cs_impl::any> *)in_RDI);
    }
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<cs_impl::any>,_phmap::Hash<cs_impl::any>,_phmap::EqualTo<cs_impl::any>,_std::allocator<cs_impl::any>_>
    ::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff50);
    iVar3.field_1 =
         (anon_union_8_1_a8a14541_for_iterator_1)(anon_union_8_1_a8a14541_for_iterator_1)local_a0;
    iVar3.ctrl_ = (ctrl_t *)key;
  }
  return (var)(proxy *)in_RDI;
}

Assistant:

var subtract(const hash_set &lhs, const hash_set &rhs)
		{
			var ret = var::make<hash_set>(lhs);
			hash_set &s = ret.val<hash_set>();
			for (auto &it: rhs) {
				if (s.count(it) > 0)
					s.erase(it);
			}
			return ret;
		}